

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  Quantity<long,_kj::_::NanosecondLabel> QVar1;
  PromiseArena *pPVar2;
  long *plVar3;
  SourceLocation location;
  HttpClient HVar4;
  void *pvVar5;
  long in_RSI;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6099:38)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_68;
  undefined8 local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_50;
  code *local_48;
  anon_class_16_2_3fe63c88_for_func local_40;
  HttpClient local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  if (*(long *)(in_RSI + 0xa8) == *(long *)(in_RSI + 0x88)) {
    *(undefined1 *)(in_RSI + 0x6c) = 0;
    plVar3 = *(long **)(in_RSI + 0x60);
    if (plVar3 != (long *)0x0 && *(int *)(in_RSI + 0x68) == 0) {
      (**(code **)(*plVar3 + 0x10))(plVar3,&local_68);
      local_68.disposer = (Disposer *)0x0;
      local_68.ptr = (PromiseFulfiller<void> *)0x0;
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x58),&local_68);
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_68);
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    QVar1.value = *(long *)(*(long *)(in_RSI + 0x88) + 0x10);
    (**(code **)(**(long **)(in_RSI + 8) + 8))(&local_70,*(long **)(in_RSI + 8),QVar1.value);
    local_48 = kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6099:38)>
               ::anon_class_16_2_3fe63c88_for_func::operator();
    pPVar2 = ((local_70.ptr)->super_PromiseArenaMember).arena;
    local_40.time.value.value =
         (Quantity<long,_kj::_::NanosecondLabel>)(Quantity<long,_kj::_::NanosecondLabel>)QVar1.value
    ;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_70.ptr - (long)pPVar2) < 0x30) {
      pvVar5 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6099:38)>
                     *)((long)pvVar5 + 0x3d0);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::_lambda()_1_,void*&>
                (location_00,&local_70,&local_40,&local_48);
      *(void **)((long)pvVar5 + 0x3d8) = pvVar5;
    }
    else {
      ((local_70.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6099:38)>
                     *)(local_70.ptr + -3);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::_lambda()_1_,void*&>
                (location_00,&local_70,&local_40,&local_48);
      local_70.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
    }
    local_68.disposer = (Disposer *)&DAT_0042a172;
    local_68.ptr = (PromiseFulfiller<void> *)&DAT_0042a1d1;
    local_58 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_50.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<void>((OwnPromiseNode *)&local_30,(Promise<void> *)&local_50,location);
    HVar4._vptr_HttpClient = local_30._vptr_HttpClient;
    local_30._vptr_HttpClient = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_30);
    (this->super_HttpClient)._vptr_HttpClient = HVar4._vptr_HttpClient;
    local_28.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_SOME(f, drainedFulfiller) {
          f->fulfill();
          drainedFulfiller = kj::none;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }